

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O2

AnyNumber<Inferences::AdditionGeneralizationImpl::MonomSet> * __thiscall
Lib::
Map<Kernel::Variable,_Inferences::AnyNumber<Inferences::AdditionGeneralizationImpl::MonomSet>,_Lib::StlHash>
::insert(Map<Kernel::Variable,_Inferences::AnyNumber<Inferences::AdditionGeneralizationImpl::MonomSet>,_Lib::StlHash>
         *this,Variable *key,AnyNumber<Inferences::AdditionGeneralizationImpl::MonomSet> *val,
        uint code)

{
  anon_struct_4_0_00000001_for___align aVar1;
  Entry *pEVar2;
  DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
  local_4c;
  
  pEVar2 = this->_entries + (ulong)code % (ulong)(uint)this->_capacity;
  while (pEVar2->code != 0) {
    if ((pEVar2->code == code) && (pEVar2->_key == (MaybeUninit<Kernel::Variable>)key->_num))
    goto LAB_003c52bf;
    pEVar2 = pEVar2 + 1;
    if (pEVar2 == this->_afterLast) {
      pEVar2 = this->_entries;
    }
  }
  this->_noOfEntries = this->_noOfEntries + 1;
  aVar1 = (anon_struct_4_0_00000001_for___align)key->_num;
  CoproductImpl::TrivialOperations::MoveCons::
  DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
  ::DefaultImpl(&local_4c,
                (DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                 *)val);
  (pEVar2->_key).__align = aVar1;
  CoproductImpl::TrivialOperations::MoveCons::
  DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
  ::DefaultImpl((DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                 *)&(pEVar2->_value).__align,&local_4c);
  pEVar2->code = code;
  CoproductImpl::TrivialOperations::Destr::
  DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
  ::~DefaultImpl(&local_4c.
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                );
LAB_003c52bf:
  return (AnyNumber<Inferences::AdditionGeneralizationImpl::MonomSet> *)&pEVar2->_value;
}

Assistant:

Val& insert(Key&& key, Val&& val,unsigned code)
  {
    Entry* entry;
    for (entry = firstEntryForCode(code); entry->occupied(); entry = nextEntry(entry)) {
      if (entry->code == code && Hash::equals(entry->key(),key)) {
        return entry->value();
      }
    }
    // entry is not occupied
    _noOfEntries++;
    entry->init(std::move(key), std::move(val), code);
    return entry->value();
  }